

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Application.cpp
# Opt level: O0

void __thiscall Application::queryEnterOrder(Application *this)

{
  bool bVar1;
  int iVar2;
  ostream *this_00;
  void *this_01;
  allocator<char> local_9d9;
  string local_9d8 [39];
  allocator<char> local_9b1;
  string local_9b0;
  NewOrderSingle local_990;
  NewOrderSingle local_838;
  NewOrderSingle local_6e0;
  NewOrderSingle local_588;
  NewOrderSingle local_430;
  NewOrderSingle local_2c8;
  Message local_170 [8];
  Message order;
  int version;
  Application *this_local;
  
  iVar2 = queryVersion(this);
  std::operator<<((ostream *)&std::cout,"\nNewOrderSingle\n");
  FIX::Message::Message(local_170);
  switch(iVar2) {
  case 0x28:
    queryNewOrderSingle40(&local_2c8,this);
    FIX::Message::operator=(local_170,(Message *)&local_2c8);
    FIX40::NewOrderSingle::~NewOrderSingle(&local_2c8);
    break;
  case 0x29:
    queryNewOrderSingle41(&local_430,this);
    FIX::Message::operator=(local_170,(Message *)&local_430);
    FIX41::NewOrderSingle::~NewOrderSingle(&local_430);
    break;
  case 0x2a:
    queryNewOrderSingle42(&local_588,this);
    FIX::Message::operator=(local_170,(Message *)&local_588);
    FIX42::NewOrderSingle::~NewOrderSingle(&local_588);
    break;
  case 0x2b:
    queryNewOrderSingle43(&local_6e0,this);
    FIX::Message::operator=(local_170,(Message *)&local_6e0);
    FIX43::NewOrderSingle::~NewOrderSingle(&local_6e0);
    break;
  case 0x2c:
    queryNewOrderSingle44(&local_838,this);
    FIX::Message::operator=(local_170,(Message *)&local_838);
    FIX44::NewOrderSingle::~NewOrderSingle(&local_838);
    break;
  default:
    this_00 = std::operator<<((ostream *)&std::cerr,"No test for version ");
    this_01 = (void *)std::ostream::operator<<(this_00,iVar2);
    std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
    break;
  case 0x32:
    queryNewOrderSingle50(&local_990,this);
    FIX::Message::operator=(local_170,(Message *)&local_990);
    FIX50::NewOrderSingle::~NewOrderSingle(&local_990);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_9b0,"Send order",&local_9b1);
  bVar1 = queryConfirm(this,&local_9b0);
  std::__cxx11::string::~string((string *)&local_9b0);
  std::allocator<char>::~allocator(&local_9b1);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_9d8,"",&local_9d9);
    FIX::Session::sendToTarget(local_170,local_9d8);
    std::__cxx11::string::~string(local_9d8);
    std::allocator<char>::~allocator(&local_9d9);
  }
  FIX::Message::~Message(local_170);
  return;
}

Assistant:

void Application::queryEnterOrder() {
  int version = queryVersion();
  std::cout << "\nNewOrderSingle\n";
  FIX::Message order;

  switch (version) {
  case 40:
    order = queryNewOrderSingle40();
    break;
  case 41:
    order = queryNewOrderSingle41();
    break;
  case 42:
    order = queryNewOrderSingle42();
    break;
  case 43:
    order = queryNewOrderSingle43();
    break;
  case 44:
    order = queryNewOrderSingle44();
    break;
  case 50:
    order = queryNewOrderSingle50();
    break;
  default:
    std::cerr << "No test for version " << version << std::endl;
    break;
  }

  if (queryConfirm("Send order")) {
    FIX::Session::sendToTarget(order);
  }
}